

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void writeAltFmtO(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                 int spike)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined *puVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  dotNode *pdVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  
  lVar9 = 0;
  do {
    fprintf((FILE *)outf,"begin_object %s%d\n",(&PTR_anon_var_dwarf_11cfb_0014bd50)[lVar9],
            (ulong)((showEnd != 0 && showBegin == 0) + 1));
    fwrite("mode solid\n",0xb,1,(FILE *)outf);
    lVar11 = 0;
    do {
      pdVar8 = results[lVar11][lVar9];
      if (pdVar8 != (dotNode *)0x0) {
        pcVar5 = getColor((int)lVar11);
        pcVar10 = "--none--";
        do {
          if ((ColorGap == '\0') && (pcVar5 = "124", pdVar8->t != (atom *)0x0)) {
            pcVar5 = assignGapColorForO(pdVar8->gap,(int)lVar9);
          }
          if (pcVar5 != pcVar10) {
            fprintf((FILE *)outf,"colour %s\n",pcVar5);
            pcVar10 = pcVar5;
          }
          dVar1 = (pdVar8->loc).x;
          dVar2 = (pdVar8->loc).y;
          dVar3 = (pdVar8->loc).z;
          if ((int)lVar9 - 3U < 3 && spike != 0) {
            fprintf((FILE *)outf,"move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",dVar1,dVar2,dVar3,
                    (pdVar8->spike).x,(pdVar8->spike).y,(pdVar8->spike).z);
          }
          else {
            fprintf((FILE *)outf,"sphere_xyz %.3f %.3f %.3f 0.03\n",dVar1,dVar2,dVar3);
          }
          pdVar8 = pdVar8->next;
        } while (pdVar8 != (dotNode_t *)0x0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x72);
    fwrite("end_object\n",0xb,1,(FILE *)outf);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 7);
  if (showEnd == 0) {
    return;
  }
  if (showBegin == 0) {
    fwrite("begin_object contsurf\n",0x16,1,(FILE *)outf);
  }
  else {
    fprintf((FILE *)outf,"begin_object %s\n",groupname);
  }
  lVar9 = 0;
  do {
    puVar4 = (&PTR_anon_var_dwarf_11cfb_0014bd50)[lVar9];
    uVar7 = 1;
    do {
      iVar6 = (int)uVar7;
      fprintf((FILE *)outf,"instance %s%d\n",puVar4,uVar7);
      uVar7 = (ulong)(iVar6 + 1);
    } while (iVar6 == 1 && (showBegin == 0 || showEnd == 0));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 7);
  fwrite("end_object\n",0xb,1,(FILE *)outf);
  return;
}

Assistant:

void writeAltFmtO(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j, numGroups, gn;
   dotNode *node;
   char *color = "", *prevColor = "";
   //Old: char *mast[NODEWIDTH] = {"WC", "CC", "SO", "BO", "HB"};
   char *mast[NODEWIDTH] = {"WC", "CC", "WH", "SO", "BO", "WO", "HB"}; /* 04/15/2015 SJ changed to match new NODEWIDTH, see probe.h*/
    
   numGroups = (showBegin && showEnd) ? 1 : 2;
   gn = (!showBegin && showEnd) ? 2 : 1;

   for (j = 0; j < NODEWIDTH; j++) {
      fprintf(outf, "begin_object %s%d\n", mast[j], gn);
      fprintf(outf, "mode solid\n");

      for (i = 0; i < NUMATOMTYPES; i++) {
	 prevColor = "--none--";
	 node = results[i][j];
	 if (node) {
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForO(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if (color != prevColor) {
	       fprintf(outf, "colour %s\n", color);
	       prevColor = color;
	    }
	    if ((j == 3 || j == 4 || j ==5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "sphere_xyz %.3f %.3f %.3f 0.03\n",
		  node->loc.x, node->loc.y, node->loc.z);
	    }
	    node = node->next;
	 }
      }
      fprintf(outf, "end_object\n");
   }

   if (showEnd) {
      if (showBegin) { fprintf(outf, "begin_object %s\n", groupname); }
      else           { fprintf(outf, "begin_object contsurf\n"); }
      for (j = 0; j < NODEWIDTH; j++) {
	 for (i = 0; i < numGroups; i++) {
	    fprintf(outf, "instance %s%d\n", mast[j], i+1);
	 }
      }
      fprintf(outf, "end_object\n");
   }
}